

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeCubeMap.cpp
# Opt level: O2

void makeCubeMap(EnvmapImage *image1,Header *header,RgbaChannels channels,char *outFileName,
                int tileWidth,int tileHeight,LevelMode levelMode,LevelRoundingMode roundingMode,
                Compression compression,int mapWidth,float filterRadius,int numSamples,bool verbose)

{
  _Alloc_hider _Var1;
  EnvmapImage *pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Array2D<Imf_3_2::Rgba> *pAVar7;
  string *psVar8;
  ostream *poVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  Compression *pCVar13;
  NoImplExc *this;
  undefined4 in_register_00000014;
  EnvmapImage *image2_00;
  int level;
  Rgba *pRVar14;
  int tileX;
  long lVar15;
  int tileY;
  int iVar16;
  allocator<char> local_f5;
  float local_f4;
  int local_f0;
  int local_ec;
  char *local_e8;
  ulong local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  Box2i faceDw;
  string name;
  TiledRgbaOutputFile out;
  EnvmapImage image2;
  Box2i dw;
  
  local_d0 = CONCAT44(in_register_00000014,channels);
  local_f4 = filterRadius;
  local_f0 = tileWidth;
  local_ec = tileHeight;
  local_e8 = outFileName;
  local_d8 = strchr(outFileName,0x25);
  if (local_d8 == (char *)0x0) {
    if (levelMode == RIPMAP_LEVELS) {
      this = (NoImplExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::NoImplExc::NoImplExc(this,"Cannot generate ripmap cube-face environments.");
      __cxa_throw(this,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
    }
    puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
    *puVar11 = 0;
    *(int *)(puVar11 + 1) = mapWidth + -1;
    *(int *)((long)puVar11 + 0xc) = mapWidth * 6 + -1;
    puVar11 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar12 = (undefined8 *)Imf_3_2::Header::displayWindow();
    *puVar12 = *puVar11;
    puVar12[1] = puVar11[1];
    pCVar13 = (Compression *)Imf_3_2::Header::compression();
    *pCVar13 = compression;
    image2._type = ENVMAP_CUBE;
    Imf_3_2::addEnvmap(header,&image2._type);
    iVar16 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&name,local_e8,header,(RgbaChannels)local_d0,local_f0,local_ec
               ,levelMode,roundingMode,iVar16);
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"writing file ");
      poVar9 = std::operator<<(poVar9,local_e8);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    EnvmapImage::EnvmapImage(&image2);
    iVar16 = 0;
    pEVar2 = &image2;
    while( true ) {
      image2_00 = pEVar2;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numLevels();
      if (iVar3 <= iVar16) break;
      if (verbose) {
        poVar9 = std::operator<<((ostream *)&std::cout,"level ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar16);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      Imf_3_2::TiledRgbaOutputFile::dataWindowForLevel((int)&out);
      resizeCube(image1,image2_00,(Box2i *)&out,local_f4,numSamples);
      pAVar7 = EnvmapImage::pixels(image2_00);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&name,(ulong)pAVar7->_data,1);
      iVar3 = 0;
      while( true ) {
        iVar4 = (int)&name;
        iVar5 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar4);
        if (iVar5 <= iVar3) break;
        iVar5 = 0;
        while( true ) {
          iVar6 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar4);
          if (iVar6 <= iVar5) break;
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar4,iVar5,iVar3);
          iVar5 = iVar5 + 1;
        }
        iVar3 = iVar3 + 1;
      }
      iVar16 = iVar16 + 1;
      pEVar2 = image1;
      image1 = image2_00;
    }
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"done.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&image2._pixels);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&name);
  }
  else {
    faceDw.max.x = mapWidth + -1;
    dw.min.x = 0;
    dw.min.y = 0;
    dw.max.y = mapWidth * 6 + -1;
    faceDw.min.x = 0;
    faceDw.min.y = 0;
    local_e0 = (ulong)(uint)mapWidth;
    faceDw.max.y = faceDw.max.x;
    dw.max.x = faceDw.max.x;
    EnvmapImage::EnvmapImage(&image2);
    resizeCube(image1,&image2,&dw,local_f4,numSamples);
    pAVar7 = EnvmapImage::pixels(&image2);
    local_d8 = (char *)((long)local_d8 - (long)local_e8);
    pRVar14 = pAVar7->_data;
    local_e0 = (ulong)(uint)((int)local_e0 * (int)local_e0);
    for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&out,local_e8,&local_f5);
      psVar8 = (string *)std::__cxx11::string::replace((ulong)&out,(ulong)local_d8,(char *)0x1);
      std::__cxx11::string::string((string *)&name,psVar8);
      std::__cxx11::string::~string((string *)&out);
      if (verbose) {
        poVar9 = std::operator<<((ostream *)&std::cout,"writing file ");
        poVar9 = std::operator<<(poVar9,(string *)&name);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      _Var1._M_p = name._M_dataplus._M_p;
      local_c8 = 0;
      uVar10 = Imf_3_2::globalThreadCount();
      Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
                ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,(Rgba *)&out,_Var1._M_p,local_f0,
                 local_ec,0,0,&faceDw,&faceDw,local_d0,&local_c8,0,compression,uVar10);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pRVar14,1);
      iVar16 = 0;
      while( true ) {
        iVar5 = (int)(Rgba *)&out;
        iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar5);
        if (iVar3 <= iVar16) break;
        iVar3 = 0;
        while( true ) {
          iVar4 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar5);
          if (iVar4 <= iVar3) break;
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar5,iVar3,iVar16);
          iVar3 = iVar3 + 1;
        }
        iVar16 = iVar16 + 1;
      }
      pRVar14 = pRVar14 + local_e0;
      Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
      std::__cxx11::string::~string((string *)&name);
    }
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"done.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&image2._pixels);
  }
  return;
}

Assistant:

void
makeCubeMap (
    EnvmapImage&      image1,
    Header&           header,
    RgbaChannels      channels,
    const char        outFileName[],
    int               tileWidth,
    int               tileHeight,
    LevelMode         levelMode,
    LevelRoundingMode roundingMode,
    Compression       compression,
    int               mapWidth,
    float             filterRadius,
    int               numSamples,
    bool              verbose)
{
    if (strchr (outFileName, '%'))
    {
        makeCubeMapSixFiles (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
    else
    {
        makeCubeMapSingleFile (
            image1,
            header,
            channels,
            outFileName,
            tileWidth,
            tileHeight,
            levelMode,
            roundingMode,
            compression,
            mapWidth,
            filterRadius,
            numSamples,
            verbose);
    }
}